

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bip32.c
# Opt level: O1

int bip32_key_with_tweak_from_parent_path
              (ext_key *hdkey,uint32_t *child_path,size_t child_path_len,uint32_t flags,
              ext_key *output)

{
  int iVar1;
  secp256k1_context_struct *ctx;
  size_t len;
  secp256k1_pubkey pub_key;
  size_t local_78;
  secp256k1_pubkey local_70;
  
  local_78 = 0x21;
  ctx = secp_ctx();
  if (ctx == (secp256k1_context_struct *)0x0) {
    iVar1 = -3;
  }
  else {
    iVar1 = -2;
    if (((flags & 5) != 0) &&
       (iVar1 = bip32_key_from_parent_path(hdkey,child_path,child_path_len,flags,output), iVar1 == 0
       )) {
      iVar1 = pubkey_parse(&local_70,hdkey->pub_key,0x21);
      if ((iVar1 != 0) &&
         ((iVar1 = secp256k1_ec_pubkey_tweak_add(ctx,&local_70,output->pub_key_tweak_sum),
          iVar1 != 0 &&
          (iVar1 = pubkey_serialize(output->pub_key,&local_78,&local_70,0x102), iVar1 != 0)))) {
        return 0;
      }
      wally_clear(output,0xc0);
      iVar1 = -2;
    }
  }
  return iVar1;
}

Assistant:

int bip32_key_with_tweak_from_parent_path(const struct ext_key *hdkey,
                                          const uint32_t *child_path,
                                          size_t child_path_len,
                                          uint32_t flags,
                                          struct ext_key *output)
{
    const secp256k1_context *ctx;
    secp256k1_pubkey pub_key;
    size_t len = EC_PUBLIC_KEY_LEN;
    int ret;

    if (!(ctx = secp_ctx()))
        return WALLY_ENOMEM;

    if (!(flags & (BIP32_FLAG_KEY_TWEAK_SUM | BIP32_FLAG_KEY_PUBLIC)))
        return WALLY_EINVAL;

    if ((ret = bip32_key_from_parent_path(hdkey, child_path,
                                          child_path_len, flags, output)) != WALLY_OK)
        return ret;

    if (!pubkey_parse(&pub_key, hdkey->pub_key, sizeof(hdkey->pub_key)) ||
        !pubkey_tweak_add(ctx, &pub_key, output->pub_key_tweak_sum) ||
        !pubkey_serialize(output->pub_key, &len, &pub_key, PUBKEY_COMPRESSED))
        return wipe_key_fail(output);

    return WALLY_OK;
}